

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

MemoryCopy * __thiscall
wasm::Builder::makeMemoryCopy
          (Builder *this,Expression *dest,Expression *source,Expression *size,Name destMemory,
          Name sourceMemory)

{
  MemoryCopy *pMVar1;
  MemoryCopy *ret;
  Expression *size_local;
  Expression *source_local;
  Expression *dest_local;
  Builder *this_local;
  Name destMemory_local;
  
  destMemory_local.super_IString.str._M_len = destMemory.super_IString.str._M_str;
  this_local = destMemory.super_IString.str._M_len;
  pMVar1 = MixedArena::alloc<wasm::MemoryCopy>((MixedArena *)(this->wasm + 0x200));
  pMVar1->dest = dest;
  pMVar1->source = source;
  pMVar1->size = size;
  Name::operator=(&pMVar1->destMemory,(Name *)&this_local);
  Name::operator=(&pMVar1->sourceMemory,&sourceMemory);
  wasm::MemoryCopy::finalize();
  return pMVar1;
}

Assistant:

MemoryCopy* makeMemoryCopy(Expression* dest,
                             Expression* source,
                             Expression* size,
                             Name destMemory,
                             Name sourceMemory) {
    auto* ret = wasm.allocator.alloc<MemoryCopy>();
    ret->dest = dest;
    ret->source = source;
    ret->size = size;
    ret->destMemory = destMemory;
    ret->sourceMemory = sourceMemory;
    ret->finalize();
    return ret;
  }